

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

NodeData * __thiscall c4::yml::Parser::_append_val(Parser *this,csubstr val,flag_t quoted)

{
  pfn_error p_Var1;
  Tree *pTVar2;
  size_t i;
  size_t i_00;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  Location LVar6;
  Location LVar7;
  bool bVar8;
  NodeData *pNVar9;
  size_t ichild;
  State *s;
  csubstr cVar10;
  char msg [32];
  size_t local_88;
  size_t local_60;
  size_t local_38;
  
  s = this->m_state;
  if ((s->flags & 0x200) != 0) {
    builtin_strncpy(msg + 0x10," has_all(SSCL))",0x10);
    builtin_strncpy(msg,"check failed: (!",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar3 = (code *)swi(3);
        pNVar9 = (NodeData *)(*pcVar3)();
        return pNVar9;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_38 = cVar10.len;
    auVar5 = ZEXT1224(ZEXT412(0x78f5) << 0x40);
    LVar4.name.str._0_4_ = (int)cVar10.str;
    LVar4.super_LineCol.offset = auVar5._0_8_;
    LVar4.super_LineCol.line = auVar5._8_8_;
    LVar4.super_LineCol.col = auVar5._16_8_;
    LVar4.name.str._4_4_ = cVar10.str._4_4_;
    LVar4.name.len = local_38;
    (*p_Var1)(msg,0x20,LVar4,(this->m_stack).m_callbacks.m_user_data);
    s = this->m_state;
  }
  pNVar9 = node(this,s);
  if (pNVar9 == (NodeData *)0x0) {
    builtin_strncpy(msg + 0x10,"ode(m_state) != ",0x10);
    builtin_strncpy(msg,"check failed: (n",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar3 = (code *)swi(3);
        pNVar9 = (NodeData *)(*pcVar3)();
        return pNVar9;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_60 = cVar10.len;
    auVar5 = ZEXT1224(ZEXT412(0x78f6) << 0x40);
    LVar6.name.str._0_4_ = (int)cVar10.str;
    LVar6.super_LineCol.offset = auVar5._0_8_;
    LVar6.super_LineCol.line = auVar5._8_8_;
    LVar6.super_LineCol.col = auVar5._16_8_;
    LVar6.name.str._4_4_ = cVar10.str._4_4_;
    LVar6.name.len = local_60;
    (*p_Var1)(msg,0x29,LVar6,(this->m_stack).m_callbacks.m_user_data);
  }
  pNVar9 = Tree::_p(this->m_tree,this->m_state->node_id);
  if (((pNVar9->m_type).type & SEQ) == NOTYPE) {
    builtin_strncpy(msg + 0x10,"_tree->is_seq(m_",0x10);
    builtin_strncpy(msg,"check failed: (m",0x10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar3 = (code *)swi(3);
        pNVar9 = (NodeData *)(*pcVar3)();
        return pNVar9;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_88 = cVar10.len;
    auVar5 = ZEXT1224(ZEXT412(0x78f7) << 0x40);
    LVar7.name.str._0_4_ = (int)cVar10.str;
    LVar7.super_LineCol.offset = auVar5._0_8_;
    LVar7.super_LineCol.line = auVar5._8_8_;
    LVar7.super_LineCol.col = auVar5._16_8_;
    LVar7.name.str._4_4_ = cVar10.str._4_4_;
    LVar7.name.len = local_88;
    (*p_Var1)(msg,0x31,LVar7,(this->m_stack).m_callbacks.m_user_data);
  }
  pTVar2 = this->m_tree;
  i = this->m_state->node_id;
  pNVar9 = Tree::_p(pTVar2,i);
  i_00 = pNVar9->m_last_child;
  if (i == 0xffffffffffffffff) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar8 = is_debugger_attached();
      if (bVar8) {
        pcVar3 = (code *)swi(3);
        pNVar9 = (NodeData *)(*pcVar3)();
        return pNVar9;
      }
    }
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = -0x4f;
    msg[9] = 'L';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    msg._24_4_ = cVar10.str._0_4_;
    msg._28_4_ = cVar10.str._4_4_;
    (*(code *)PTR_error_impl_00231528)
              ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
  }
  pNVar9 = Tree::_p(pTVar2,i);
  if (((pNVar9->m_type).type & (STREAM|MAP)) == NOTYPE) {
    bVar8 = Tree::is_root(pTVar2,i);
    if (!bVar8) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar8 = is_debugger_attached();
        if (bVar8) {
          pcVar3 = (code *)swi(3);
          pNVar9 = (NodeData *)(*pcVar3)();
          return pNVar9;
        }
      }
      cVar10 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = -0x4e;
      msg[9] = 'L';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      msg._24_4_ = cVar10.str._0_4_;
      msg._28_4_ = cVar10.str._4_4_;
      (*(code *)PTR_error_impl_00231528)
                ("check failed: is_container(parent) || is_root(parent)",0x35,
                 (anonymous_namespace)::s_default_callbacks);
    }
  }
  if (i_00 != 0xffffffffffffffff) {
    pNVar9 = Tree::_p(pTVar2,i_00);
    if (pNVar9->m_parent != i) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar8 = is_debugger_attached();
        if (bVar8) {
          pcVar3 = (code *)swi(3);
          pNVar9 = (NodeData *)(*pcVar3)();
          return pNVar9;
        }
      }
      cVar10 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = -0x4d;
      msg[9] = 'L';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      msg._24_4_ = cVar10.str._0_4_;
      msg._28_4_ = cVar10.str._4_4_;
      (*(code *)PTR_error_impl_00231528)
                ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                 (anonymous_namespace)::s_default_callbacks);
    }
  }
  ichild = Tree::_claim(pTVar2);
  Tree::_set_hierarchy(pTVar2,ichild,i,i_00);
  Tree::to_val(this->m_tree,ichild,val,(ulong)(quoted != 0) << 0xc);
  if ((this->m_val_tag).str != (char *)0x0 && (this->m_val_tag).len != 0) {
    pTVar2 = this->m_tree;
    cVar10 = normalize_tag(this->m_val_tag);
    Tree::set_val_tag(pTVar2,ichild,cVar10);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
  }
  _write_val_anchor(this,ichild);
  pNVar9 = Tree::get(this->m_tree,ichild);
  return pNVar9;
}

Assistant:

NodeData* Parser::_append_val(csubstr val, flag_t quoted)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks,  ! has_all(SSCL));
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) != nullptr);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_tree->is_seq(m_state->node_id));
    type_bits additional_flags = quoted ? VALQUO : NOTYPE;
    _c4dbgpf("append val: '{}' to parent id={} (level={}){}", val, m_state->node_id, m_state->level, quoted ? " VALQUO!" : "");
    size_t nid = m_tree->append_child(m_state->node_id);
    m_tree->to_val(nid, val, additional_flags);

    _c4dbgpf("append val: id={} val='{}'", nid, m_tree->get(nid)->m_val.scalar);
    if( ! m_val_tag.empty())
    {
        _c4dbgpf("append val[{}]: set val tag='{}' -> '{}'", nid, m_val_tag, normalize_tag(m_val_tag));
        m_tree->set_val_tag(nid, normalize_tag(m_val_tag));
        m_val_tag.clear();
    }
    _write_val_anchor(nid);
    return m_tree->get(nid);
}